

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O3

int process_options(int cnt,char **args)

{
  char *__src;
  int iVar1;
  size_t sVar2;
  
LAB_001048bf:
  iVar1 = __posix_getopt(cnt,args,"ab:cdhi:n:Nl:o:p:r:s:t:vx");
  __src = _optarg;
  switch(iVar1) {
  case 0x61:
    flags._1_1_ = flags._1_1_ | 2;
    goto LAB_001048bf;
  case 0x62:
    sVar2 = strlen(_optarg);
    d_path = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (d_path == (char *)0x0) goto LAB_00104ba9;
    strcpy(d_path,__src);
    goto LAB_001048bf;
  case 99:
    flags._1_1_ = flags._1_1_ | 8;
    goto LAB_001048bf;
  case 100:
    flags._0_1_ = (byte)flags | 1;
    goto LAB_001048bf;
  case 0x68:
    goto switchD_001048dc_caseD_68;
  case 0x69:
    sVar2 = strlen(_optarg);
    ifile = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (ifile != (char *)0x0) {
      strcpy(ifile,__src);
      flags._1_1_ = flags._1_1_ | 0x10;
      goto LAB_001048bf;
    }
    process_options_cold_6();
    break;
  case 0x6c:
    sVar2 = strlen(_optarg);
    lfile = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (lfile != (char *)0x0) {
      strcpy(lfile,__src);
      flags._0_1_ = (byte)flags | 0x40;
      goto LAB_001048bf;
    }
    break;
  case 0x6e:
    sVar2 = strlen(_optarg);
    db_name = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (db_name == (char *)0x0) goto LAB_00104b9a;
    strcpy(db_name,__src);
    flags._0_1_ = (byte)flags | 8;
    goto LAB_001048bf;
  case 0x6f:
    sVar2 = strlen(_optarg);
    osuff = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (osuff == (char *)0x0) goto LAB_00104b9f;
    strcpy(osuff,__src);
    flags._0_1_ = (byte)flags | 2;
    goto LAB_001048bf;
  case 0x70:
    snum = atoi(_optarg);
    goto LAB_001048bf;
  case 0x72:
    flags._1_1_ = flags._1_1_ | 4;
    rndm = atol(_optarg);
    goto LAB_001048bf;
  case 0x73:
    flt_scale = atof(_optarg);
    if (100000 < scale) {
      process_options_cold_2();
    }
    goto LAB_001048bf;
  case 0x74:
    sVar2 = strlen(_optarg);
    tfile = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    if (tfile == (char *)0x0) goto LAB_00104ba4;
    strcpy(tfile,__src);
    flags._1_1_ = flags._1_1_ | 0x20;
    goto LAB_001048bf;
  case 0x76:
    flags._0_1_ = (byte)flags | 0x10;
    goto LAB_001048bf;
  case 0x78:
    flags._0_1_ = (byte)flags | 4;
    goto LAB_001048bf;
  default:
    if (iVar1 == 0x4e) goto code_r0x001048f0;
    if (iVar1 == -1) {
      return 0;
    }
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x71:
  case 0x75:
  case 0x77:
    printf("unknown option \'%s\' ignored\n",args[_optind]);
    usage();
    exit(1);
  }
  process_options_cold_5();
LAB_00104b9a:
  process_options_cold_4();
LAB_00104b9f:
  process_options_cold_3();
LAB_00104ba4:
  process_options_cold_1();
LAB_00104ba9:
  process_options_cold_7();
switchD_001048dc_caseD_68:
  usage();
  exit(0);
code_r0x001048f0:
  flags._1_1_ = flags._1_1_ | 0x40;
  goto LAB_001048bf;
}

Assistant:

int
process_options(int cnt, char **args)
{
    int flag;

    while((flag = getopt(cnt, args, "ab:cdhi:n:Nl:o:p:r:s:t:vx")) != -1)
        switch(flag)
            {
            case 'a':   /* use ANSI semantics */
                flags |= ANSI;
                break;
			case 'b':               /* load distributions from named file */
				d_path = (char *)malloc((int)strlen(optarg) + 1);
				MALLOC_CHECK(d_path);
				strcpy(d_path, optarg);
				break;
			case 'c':   /* retain comments in EQT */
                flags |= COMMENT;
                break;
            case 'd':   /* use default substitution values */
                flags |= DFLT;
                break;
            case 'h':   /* just generate the usage summary */
                usage();
                exit(0);
                break;
            case 'i':   /* set stream initialization file name */
                ifile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(ifile);
                strcpy(ifile, optarg);
                flags |= INIT;
                break;
            case 'l':   /* log parameter usages */
                lfile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(lfile);
                strcpy(lfile, optarg);
                flags |= LOG;
                break;
            case 'N':   /* use default rowcounts */
                flags |= DFLT_NUM;
                break;
            case 'n':   /* set database name */
                db_name = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(db_name);
                strcpy(db_name, optarg);
                flags |= DBASE;
                break;
            case 'o':   /* set the output path */
                osuff = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(osuff);
                strcpy(osuff, optarg);
                flags |=OUTPUT;
                break;
            case 'p':   /* permutation for a given stream */
                snum = atoi(optarg);
                break;
            case 'r':   /* set random number seed for parameter gen */
                flags |= SEED;
                rndm = atol(optarg);
                break;
            case 's':   /* scale of data set to run against */
                flt_scale = atof(optarg);
				if (scale > MAX_SCALE)
					fprintf(stderr, "%s %5.0f %s\n%s\n",
						"WARNING: Support for scale factors >",
						MAX_SCALE,
						"GB is still in development.",
						"Data set integrity is not guaranteed.\n");
                break;
            case 't':   /* set termination file name */
                tfile = malloc((int)strlen(optarg) + 1);
                MALLOC_CHECK(tfile);
                strcpy(tfile, optarg);
                flags |= TERMINATE;
                break;
            case 'v':   /* verbose */
                flags |= VERBOSE;
                break;
            case 'x':   /* set explain in the queries */
                flags |= EXPLAIN;
                break;
            default:
                printf("unknown option '%s' ignored\n", args[optind]);
                usage();
                exit(1);
                break;
            }
    return(0);
}